

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_CallSpecial
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  AActor *activator;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  VMValue *pVVar5;
  VMValue *pVVar6;
  VMValue *pVVar7;
  VMValue *pVVar8;
  char *pcVar9;
  int iVar10;
  bool bVar11;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      activator = (AActor *)(param->field_0).field_1.a;
      if (activator != (AActor *)0x0) {
        if ((activator->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(activator->super_DThinker).super_DObject._vptr_DObject)(activator);
          (activator->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (activator->super_DThinker).super_DObject.Class;
        bVar11 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar11) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar11 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar11) {
          pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003c9be1;
        }
      }
      if (numparam == 1) {
        pcVar9 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          pVVar1 = param + 1;
          if (numparam < 3) {
            pVVar5 = defaultparam->Array;
            if (pVVar5[2].field_0.field_3.Type != '\0') {
              pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003c9c3e;
            }
          }
          else {
            pVVar5 = param;
            if (param[2].field_0.field_3.Type != '\0') {
              pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003c9c3e:
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x597,
                            "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 4) {
            pVVar6 = defaultparam->Array;
            if (pVVar6[3].field_0.field_3.Type != '\0') {
              pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003c9c5d;
            }
          }
          else {
            pVVar6 = param;
            if (param[3].field_0.field_3.Type != '\0') {
              pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003c9c5d:
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x598,
                            "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 5) {
            pVVar7 = defaultparam->Array;
            if (pVVar7[4].field_0.field_3.Type != '\0') {
              pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003c9c7c;
            }
          }
          else {
            pVVar7 = param;
            if (param[4].field_0.field_3.Type != '\0') {
              pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003c9c7c:
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x599,
                            "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 6) {
            pVVar8 = defaultparam->Array;
            if (pVVar8[5].field_0.field_3.Type != '\0') {
              pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003c9c9b;
            }
          }
          else {
            pVVar8 = param;
            if (param[5].field_0.field_3.Type != '\0') {
              pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003c9c9b:
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x59a,
                            "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 7) {
            param = defaultparam->Array;
            if (param[6].field_0.field_3.Type == '\0') goto LAB_003c9b43;
            pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[6].field_0.field_3.Type == '\0') {
LAB_003c9b43:
              iVar10 = 0;
              iVar3 = P_ExecuteSpecial((pVVar1->field_0).i,(line_t *)0x0,activator,false,
                                       pVVar5[2].field_0.i,pVVar6[3].field_0.i,pVVar7[4].field_0.i,
                                       pVVar8[5].field_0.i,param[6].field_0.i);
              if (0 < numret) {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x59f,
                                "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                if (ret->RegType != '\0') {
                  __assert_fail("RegType == REGT_INT",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                ,0x13f,"void VMReturn::SetInt(int)");
                }
                *(uint *)ret->Location = (uint)(iVar3 != 0);
                iVar10 = 1;
              }
              return iVar10;
            }
            pcVar9 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x59b,
                        "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar9 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x596,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003c9be1:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x595,
                "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CallSpecial)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(special);
	PARAM_INT_DEF	(arg1);
	PARAM_INT_DEF	(arg2);
	PARAM_INT_DEF	(arg3);
	PARAM_INT_DEF	(arg4);
	PARAM_INT_DEF	(arg5);

	bool res = !!P_ExecuteSpecial(special, NULL, self, false, arg1, arg2, arg3, arg4, arg5);

	ACTION_RETURN_BOOL(res);
}